

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O0

void __thiscall
tcmalloc::PageHeapAllocator<tcmalloc::StackTrace>::Delete
          (PageHeapAllocator<tcmalloc::StackTrace> *this,StackTrace *p)

{
  StackTrace *p_local;
  PageHeapAllocator<tcmalloc::StackTrace> *this_local;
  
  p->size = (uintptr_t)this->free_list_;
  this->free_list_ = p;
  this->inuse_ = this->inuse_ + -1;
  return;
}

Assistant:

void Delete(T* p) {
#ifndef NDEBUG
    memset(static_cast<void*>(p), 0xAA, sizeof(T));
#endif
    *(reinterpret_cast<void**>(p)) = free_list_;
    free_list_ = p;
    inuse_--;
  }